

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::EnsureInlineeCommon
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee,Type *codeGenRuntimeData)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar5;
  FunctionCodeGenRuntimeData *pFVar6;
  undefined1 local_68 [8];
  TrackAllocData data;
  Type inlineeData;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x56,"(recycler)","recycler");
    if (!bVar2) goto LAB_00893e49;
    *puVar3 = 0;
  }
  if (((this->functionBody).ptr)->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x57,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_00893e49;
    *puVar3 = 0;
  }
  if (inlinee == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x58,"(inlinee)","inlinee");
    if (!bVar2) {
LAB_00893e49:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pWVar5 = codeGenRuntimeData->ptr;
  if (pWVar5 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    data.plusSize = (size_t)((this->functionBody).ptr)->profiledCallSiteCount;
    local_68 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_49c6d22;
    data.filename._0_4_ = 0x5c;
    pRVar4 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    pWVar5 = Memory::
             AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>,false>
                       ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocZero,0,
                        (ulong)((this->functionBody).ptr)->profiledCallSiteCount);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::
    WriteBarrierSet(codeGenRuntimeData,pWVar5);
    pWVar5 = codeGenRuntimeData->ptr;
  }
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
            ((WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&data.line,
             pWVar5 + profiledCallSiteId);
  pFVar6 = (FunctionCodeGenRuntimeData *)data._32_8_;
  if (data._32_8_ == 0) {
    local_68 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_49c6d22;
    data.filename._0_4_ = 99;
    pRVar4 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    pFVar6 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar4,0x37a1d4);
    FunctionCodeGenRuntimeData(pFVar6,inlinee);
  }
  else {
    for (; pFVar6 != (FunctionCodeGenRuntimeData *)0x0; pFVar6 = (pFVar6->next).ptr) {
      if ((pFVar6->functionBody).ptr == inlinee) {
        return pFVar6;
      }
    }
    local_68 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_49c6d22;
    data.filename._0_4_ = 0x75;
    pRVar4 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    pFVar6 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar4,0x37a1d4);
    FunctionCodeGenRuntimeData(pFVar6,inlinee);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierSet
              (&pFVar6->next,(FunctionCodeGenRuntimeData *)data._32_8_);
  }
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierSet
            (codeGenRuntimeData->ptr + profiledCallSiteId,pFVar6);
  return pFVar6;
}

Assistant:

FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::EnsureInlineeCommon(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee,
        Field(Field(FunctionCodeGenRuntimeData *)*) & codeGenRuntimeData)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee);

        if (codeGenRuntimeData == nullptr)
        {
            codeGenRuntimeData = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData *), functionBody->GetProfiledCallSiteCount());
        }

        Field(FunctionCodeGenRuntimeData *) const inlineeData = codeGenRuntimeData[profiledCallSiteId];

        if (inlineeData == nullptr)
        {
            FunctionCodeGenRuntimeData * runtimeData = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
            codeGenRuntimeData[profiledCallSiteId] = runtimeData;
            return runtimeData;
        }

        // Find the right code gen runtime data
        FunctionCodeGenRuntimeData * next = inlineeData;

        while (next && (next->GetFunctionBody() != inlinee))
        {
            next = next->GetNext();
        }

        if (next)
        {
            return next;
        }

        FunctionCodeGenRuntimeData * runtimeData = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
        runtimeData->SetupRuntimeDataChain(inlineeData);
        codeGenRuntimeData[profiledCallSiteId] = runtimeData;
        return runtimeData;
    }